

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O2

void __thiscall btTriangleMesh::addIndex(btTriangleMesh *this,int index)

{
  long lVar1;
  unsigned_short local_e;
  uint local_c;
  
  if (this->m_use32bitIndices == true) {
    local_c = index;
    btAlignedObjectArray<unsigned_int>::push_back(&this->m_32bitIndices,&local_c);
    lVar1 = 0xb8;
  }
  else {
    local_e = (unsigned_short)index;
    btAlignedObjectArray<unsigned_short>::push_back(&this->m_16bitIndices,&local_e);
    lVar1 = 0xd8;
  }
  ((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data)->m_triangleIndexBase =
       *(uchar **)
        ((long)(this->super_btTriangleIndexVertexArray).super_btStridingMeshInterface.m_scaling.
               m_floats + lVar1 + -8);
  return;
}

Assistant:

void	btTriangleMesh::addIndex(int index)
{
	if (m_use32bitIndices)
	{
		m_32bitIndices.push_back(index);
		m_indexedMeshes[0].m_triangleIndexBase = (unsigned char*) &m_32bitIndices[0];
	} else
	{
		m_16bitIndices.push_back(index);
		m_indexedMeshes[0].m_triangleIndexBase = (unsigned char*) &m_16bitIndices[0];
	}
}